

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn_reader.c
# Opt level: O1

RNNModel * rnnoise_model_from_file(FILE *f)

{
  int iVar1;
  RNNModel *model;
  DenseLayer *pDVar2;
  GRULayer *pGVar3;
  GRULayer *pGVar4;
  GRULayer *pGVar5;
  DenseLayer *pDVar6;
  DenseLayer *pDVar7;
  rnn_weight *prVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  int in;
  uint local_54;
  GRULayer *local_50;
  DenseLayer *local_48;
  DenseLayer *local_40;
  GRULayer *local_38;
  
  iVar1 = __isoc99_fscanf(f,"rnnoise-nu model file version %d\n",&local_54);
  if (iVar1 != 1) {
    return (RNNModel *)0x0;
  }
  if (local_54 != 1) {
    return (RNNModel *)0x0;
  }
  model = (RNNModel *)calloc(1,0x60);
  if (model == (RNNModel *)0x0) {
    return (RNNModel *)0x0;
  }
  pDVar2 = (DenseLayer *)calloc(1,0x20);
  if (pDVar2 != (DenseLayer *)0x0) {
    model->input_dense = pDVar2;
    pGVar3 = (GRULayer *)calloc(1,0x28);
    if (pGVar3 != (GRULayer *)0x0) {
      model->vad_gru = pGVar3;
      pGVar4 = (GRULayer *)calloc(1,0x28);
      if (pGVar4 != (GRULayer *)0x0) {
        model->noise_gru = pGVar4;
        pGVar5 = (GRULayer *)calloc(1,0x28);
        if (pGVar5 != (GRULayer *)0x0) {
          model->denoise_gru = pGVar5;
          local_50 = pGVar5;
          pDVar6 = (DenseLayer *)calloc(1,0x20);
          if (pDVar6 != (DenseLayer *)0x0) {
            model->denoise_output = pDVar6;
            pDVar7 = (DenseLayer *)calloc(1,0x20);
            if (pDVar7 != (DenseLayer *)0x0) {
              model->vad_output = pDVar7;
              local_48 = pDVar6;
              local_40 = pDVar7;
              iVar1 = __isoc99_fscanf(f,"%d",&local_54);
              if (local_54 < 0x81 && iVar1 == 1) {
                pDVar2->nb_inputs = local_54;
                iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                if (local_54 < 0x81 && iVar1 == 1) {
                  pDVar2->nb_neurons = local_54;
                  model->input_dense_size = local_54;
                  iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                  bVar11 = 0x80 < local_54;
                  if (bVar11 || iVar1 != 1) {
                    rnnoise_model_free(model);
                  }
                  else if ((char)local_54 == '\x02') {
                    pDVar2->activation = 2;
                  }
                  else if ((local_54 & 0xff) == 1) {
                    pDVar2->activation = 1;
                  }
                  else {
                    pDVar2->activation = 0;
                  }
                  if (bVar11 || iVar1 != 1) {
                    return (RNNModel *)0x0;
                  }
                  prVar8 = (rnn_weight *)malloc((long)pDVar2->nb_neurons * (long)pDVar2->nb_inputs);
                  if (prVar8 != (rnn_weight *)0x0) {
                    pDVar2->input_weights = prVar8;
                    iVar1 = pDVar2->nb_neurons;
                    if (0 < pDVar2->nb_inputs * iVar1) {
                      lVar9 = 0;
                      local_38 = pGVar4;
                      do {
                        iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                        if (iVar1 != 1) goto LAB_00104725;
                        prVar8[lVar9] = (rnn_weight)local_54;
                        lVar9 = lVar9 + 1;
                        iVar1 = pDVar2->nb_neurons;
                        pGVar4 = local_38;
                      } while (lVar9 < (long)pDVar2->nb_inputs * (long)iVar1);
                    }
                    pGVar5 = (GRULayer *)malloc((long)iVar1);
                    if (pGVar5 != (GRULayer *)0x0) {
                      pDVar2->bias = (rnn_weight *)pGVar5;
                      if (0 < pDVar2->nb_neurons) {
                        lVar9 = 0;
                        local_38 = pGVar5;
                        do {
                          iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                          if (iVar1 != 1) goto LAB_00104725;
                          *(rnn_weight *)((long)&local_38->bias + lVar9) = (rnn_weight)local_54;
                          lVar9 = lVar9 + 1;
                        } while (lVar9 < pDVar2->nb_neurons);
                      }
                      iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                      if (local_54 < 0x81 && iVar1 == 1) {
                        pGVar3->nb_inputs = local_54;
                        iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                        if (local_54 < 0x81 && iVar1 == 1) {
                          pGVar3->nb_neurons = local_54;
                          model->vad_gru_size = local_54;
                          iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                          bVar11 = 0x80 < local_54;
                          if (bVar11 || iVar1 != 1) {
                            rnnoise_model_free(model);
                          }
                          else if ((char)local_54 == '\x02') {
                            pGVar3->activation = 2;
                          }
                          else if ((local_54 & 0xff) == 1) {
                            pGVar3->activation = 1;
                          }
                          else {
                            pGVar3->activation = 0;
                          }
                          if (bVar11 || iVar1 != 1) {
                            return (RNNModel *)0x0;
                          }
                          prVar8 = (rnn_weight *)
                                   malloc((long)(pGVar3->nb_inputs * pGVar3->nb_neurons * 3));
                          if (prVar8 != (rnn_weight *)0x0) {
                            pGVar3->input_weights = prVar8;
                            iVar1 = pGVar3->nb_neurons;
                            if (0 < pGVar3->nb_inputs * iVar1 * 3) {
                              lVar9 = 0;
                              do {
                                iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                if (iVar1 != 1) goto LAB_00104725;
                                prVar8[lVar9] = (rnn_weight)local_54;
                                lVar9 = lVar9 + 1;
                                iVar1 = pGVar3->nb_neurons;
                              } while (lVar9 < pGVar3->nb_inputs * iVar1 * 3);
                            }
                            prVar8 = (rnn_weight *)malloc((ulong)(uint)(iVar1 * iVar1 * 3));
                            if (prVar8 != (rnn_weight *)0x0) {
                              pGVar3->recurrent_weights = prVar8;
                              iVar1 = pGVar3->nb_neurons;
                              if (iVar1 * iVar1 * 3 != 0) {
                                uVar10 = 0;
                                do {
                                  iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                  if (iVar1 != 1) goto LAB_00104725;
                                  prVar8[uVar10] = (rnn_weight)local_54;
                                  uVar10 = uVar10 + 1;
                                  iVar1 = pGVar3->nb_neurons;
                                } while (uVar10 < (uint)(iVar1 * iVar1 * 3));
                              }
                              prVar8 = (rnn_weight *)malloc((long)(iVar1 * 3));
                              if (prVar8 != (rnn_weight *)0x0) {
                                pGVar3->bias = prVar8;
                                if (0 < pGVar3->nb_neurons) {
                                  lVar9 = 0;
                                  do {
                                    iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                    if (iVar1 != 1) goto LAB_00104725;
                                    prVar8[lVar9] = (rnn_weight)local_54;
                                    lVar9 = lVar9 + 1;
                                  } while (lVar9 < (long)pGVar3->nb_neurons * 3);
                                }
                                iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                if (local_54 < 0x81 && iVar1 == 1) {
                                  pGVar4->nb_inputs = local_54;
                                  iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                  if (local_54 < 0x81 && iVar1 == 1) {
                                    pGVar4->nb_neurons = local_54;
                                    model->noise_gru_size = local_54;
                                    iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                    bVar11 = 0x80 < local_54;
                                    if (bVar11 || iVar1 != 1) {
                                      rnnoise_model_free(model);
                                    }
                                    else if ((char)local_54 == '\x02') {
                                      pGVar4->activation = 2;
                                    }
                                    else if ((local_54 & 0xff) == 1) {
                                      pGVar4->activation = 1;
                                    }
                                    else {
                                      pGVar4->activation = 0;
                                    }
                                    if (bVar11 || iVar1 != 1) {
                                      return (RNNModel *)0x0;
                                    }
                                    prVar8 = (rnn_weight *)
                                             malloc((long)(pGVar4->nb_inputs * pGVar4->nb_neurons *
                                                          3));
                                    if (prVar8 != (rnn_weight *)0x0) {
                                      pGVar4->input_weights = prVar8;
                                      iVar1 = pGVar4->nb_neurons;
                                      if (0 < pGVar4->nb_inputs * iVar1 * 3) {
                                        lVar9 = 0;
                                        do {
                                          iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                          if (iVar1 != 1) goto LAB_00104725;
                                          prVar8[lVar9] = (rnn_weight)local_54;
                                          lVar9 = lVar9 + 1;
                                          iVar1 = pGVar4->nb_neurons;
                                        } while (lVar9 < pGVar4->nb_inputs * iVar1 * 3);
                                      }
                                      prVar8 = (rnn_weight *)
                                               malloc((ulong)(uint)(iVar1 * iVar1 * 3));
                                      if (prVar8 != (rnn_weight *)0x0) {
                                        pGVar4->recurrent_weights = prVar8;
                                        iVar1 = pGVar4->nb_neurons;
                                        if (iVar1 * iVar1 * 3 != 0) {
                                          uVar10 = 0;
                                          do {
                                            iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                            if (iVar1 != 1) goto LAB_00104725;
                                            prVar8[uVar10] = (rnn_weight)local_54;
                                            uVar10 = uVar10 + 1;
                                            iVar1 = pGVar4->nb_neurons;
                                          } while (uVar10 < (uint)(iVar1 * iVar1 * 3));
                                        }
                                        prVar8 = (rnn_weight *)malloc((long)(iVar1 * 3));
                                        if (prVar8 != (rnn_weight *)0x0) {
                                          pGVar4->bias = prVar8;
                                          if (0 < pGVar4->nb_neurons) {
                                            lVar9 = 0;
                                            do {
                                              iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                              if (iVar1 != 1) goto LAB_00104725;
                                              prVar8[lVar9] = (rnn_weight)local_54;
                                              lVar9 = lVar9 + 1;
                                            } while (lVar9 < (long)pGVar4->nb_neurons * 3);
                                          }
                                          iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                          if (local_54 < 0x81 && iVar1 == 1) {
                                            local_50->nb_inputs = local_54;
                                            iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                            if (local_54 < 0x81 && iVar1 == 1) {
                                              local_50->nb_neurons = local_54;
                                              model->denoise_gru_size = local_54;
                                              iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                              bVar11 = 0x80 < local_54;
                                              if (bVar11 || iVar1 != 1) {
                                                rnnoise_model_free(model);
                                              }
                                              else if ((char)local_54 == '\x02') {
                                                local_50->activation = 2;
                                              }
                                              else if ((local_54 & 0xff) == 1) {
                                                local_50->activation = 1;
                                              }
                                              else {
                                                local_50->activation = 0;
                                              }
                                              if (bVar11 || iVar1 != 1) {
                                                return (RNNModel *)0x0;
                                              }
                                              prVar8 = (rnn_weight *)
                                                       malloc((long)(local_50->nb_inputs *
                                                                     local_50->nb_neurons * 3));
                                              if (prVar8 != (rnn_weight *)0x0) {
                                                local_50->input_weights = prVar8;
                                                iVar1 = local_50->nb_neurons;
                                                if (0 < local_50->nb_inputs * iVar1 * 3) {
                                                  lVar9 = 0;
                                                  do {
                                                    iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                                    if (iVar1 != 1) goto LAB_00104725;
                                                    prVar8[lVar9] = (rnn_weight)local_54;
                                                    lVar9 = lVar9 + 1;
                                                    iVar1 = local_50->nb_neurons;
                                                  } while (lVar9 < local_50->nb_inputs * iVar1 * 3);
                                                }
                                                prVar8 = (rnn_weight *)
                                                         malloc((ulong)(uint)(iVar1 * iVar1 * 3));
                                                if (prVar8 != (rnn_weight *)0x0) {
                                                  local_50->recurrent_weights = prVar8;
                                                  iVar1 = local_50->nb_neurons;
                                                  if (iVar1 * iVar1 * 3 != 0) {
                                                    uVar10 = 0;
                                                    do {
                                                      iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                                      if (iVar1 != 1) goto LAB_00104725;
                                                      prVar8[uVar10] = (rnn_weight)local_54;
                                                      uVar10 = uVar10 + 1;
                                                      iVar1 = local_50->nb_neurons;
                                                    } while (uVar10 < (uint)(iVar1 * iVar1 * 3));
                                                  }
                                                  prVar8 = (rnn_weight *)malloc((long)(iVar1 * 3));
                                                  if (prVar8 != (rnn_weight *)0x0) {
                                                    local_50->bias = prVar8;
                                                    if (0 < local_50->nb_neurons) {
                                                      lVar9 = 0;
                                                      do {
                                                        iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                                        if (iVar1 != 1) goto LAB_00104725;
                                                        prVar8[lVar9] = (rnn_weight)local_54;
                                                        lVar9 = lVar9 + 1;
                                                      } while (lVar9 < (long)local_50->nb_neurons *
                                                                       3);
                                                    }
                                                    iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                                    if (local_54 < 0x81 && iVar1 == 1) {
                                                      local_48->nb_inputs = local_54;
                                                      iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                                      if (local_54 < 0x81 && iVar1 == 1) {
                                                        local_48->nb_neurons = local_54;
                                                        model->denoise_output_size = local_54;
                                                        iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                                        bVar11 = 0x80 < local_54;
                                                        if (bVar11 || iVar1 != 1) {
                                                          rnnoise_model_free(model);
                                                        }
                                                        else if ((char)local_54 == '\x02') {
                                                          local_48->activation = 2;
                                                        }
                                                        else if ((local_54 & 0xff) == 1) {
                                                          local_48->activation = 1;
                                                        }
                                                        else {
                                                          local_48->activation = 0;
                                                        }
                                                        if (bVar11 || iVar1 != 1) {
                                                          return (RNNModel *)0x0;
                                                        }
                                                        prVar8 = (rnn_weight *)
                                                                 malloc((long)local_48->nb_neurons *
                                                                        (long)local_48->nb_inputs);
                                                        if (prVar8 != (rnn_weight *)0x0) {
                                                          local_48->input_weights = prVar8;
                                                          iVar1 = local_48->nb_neurons;
                                                          if (0 < local_48->nb_inputs * iVar1) {
                                                            lVar9 = 0;
                                                            do {
                                                              iVar1 = __isoc99_fscanf(f,"%d",&
                                                  local_54);
                                                  if (iVar1 != 1) goto LAB_00104725;
                                                  prVar8[lVar9] = (rnn_weight)local_54;
                                                  lVar9 = lVar9 + 1;
                                                  iVar1 = local_48->nb_neurons;
                                                  } while (lVar9 < (long)local_48->nb_inputs *
                                                                   (long)iVar1);
                                                  }
                                                  prVar8 = (rnn_weight *)malloc((long)iVar1);
                                                  if (prVar8 != (rnn_weight *)0x0) {
                                                    local_48->bias = prVar8;
                                                    if (0 < local_48->nb_neurons) {
                                                      lVar9 = 0;
                                                      do {
                                                        iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                                        if (iVar1 != 1) goto LAB_00104725;
                                                        prVar8[lVar9] = (rnn_weight)local_54;
                                                        lVar9 = lVar9 + 1;
                                                      } while (lVar9 < local_48->nb_neurons);
                                                    }
                                                    iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                                    if (local_54 < 0x81 && iVar1 == 1) {
                                                      local_40->nb_inputs = local_54;
                                                      iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                                      if (local_54 < 0x81 && iVar1 == 1) {
                                                        local_40->nb_neurons = local_54;
                                                        model->vad_output_size = local_54;
                                                        iVar1 = __isoc99_fscanf(f,"%d",&local_54);
                                                        bVar11 = 0x80 < local_54;
                                                        if (bVar11 || iVar1 != 1) {
                                                          rnnoise_model_free(model);
                                                        }
                                                        else if ((char)local_54 == '\x02') {
                                                          local_40->activation = 2;
                                                        }
                                                        else if ((local_54 & 0xff) == 1) {
                                                          local_40->activation = 1;
                                                        }
                                                        else {
                                                          local_40->activation = 0;
                                                        }
                                                        if (bVar11 || iVar1 != 1) {
                                                          return (RNNModel *)0x0;
                                                        }
                                                        prVar8 = (rnn_weight *)
                                                                 malloc((long)local_40->nb_neurons *
                                                                        (long)local_40->nb_inputs);
                                                        if (prVar8 != (rnn_weight *)0x0) {
                                                          local_40->input_weights = prVar8;
                                                          iVar1 = local_40->nb_neurons;
                                                          if (0 < local_40->nb_inputs * iVar1) {
                                                            lVar9 = 0;
                                                            do {
                                                              iVar1 = __isoc99_fscanf(f,"%d",&
                                                  local_54);
                                                  if (iVar1 != 1) goto LAB_00104725;
                                                  prVar8[lVar9] = (rnn_weight)local_54;
                                                  lVar9 = lVar9 + 1;
                                                  iVar1 = local_40->nb_neurons;
                                                  } while (lVar9 < (long)local_40->nb_inputs *
                                                                   (long)iVar1);
                                                  }
                                                  prVar8 = (rnn_weight *)malloc((long)iVar1);
                                                  if (prVar8 != (rnn_weight *)0x0) {
                                                    local_40->bias = prVar8;
                                                    if (local_40->nb_neurons < 1) {
                                                      return model;
                                                    }
                                                    lVar9 = 0;
                                                    while (iVar1 = __isoc99_fscanf(f,"%d",&local_54)
                                                          , iVar1 == 1) {
                                                      prVar8[lVar9] = (rnn_weight)local_54;
                                                      lVar9 = lVar9 + 1;
                                                      if (local_40->nb_neurons <= lVar9) {
                                                        return model;
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00104725:
  rnnoise_model_free(model);
  return (RNNModel *)0x0;
}

Assistant:

RNNModel *rnnoise_model_from_file(FILE *f) {
    int i, in;

    if (fscanf(f, "rnnoise-nu model file version %d\n", &in) != 1 || in != 1)
        return NULL;

    RNNModel *ret = calloc(1, sizeof(RNNModel));
    if (!ret)
        return NULL;

#define ALLOC_LAYER(type, name) \
    type *name; \
    name = calloc(1, sizeof(type)); \
    if (!name) { \
        rnnoise_model_free(ret); \
        return NULL; \
    } \
    ret->name = name

    ALLOC_LAYER(DenseLayer, input_dense);
    ALLOC_LAYER(GRULayer, vad_gru);
    ALLOC_LAYER(GRULayer, noise_gru);
    ALLOC_LAYER(GRULayer, denoise_gru);
    ALLOC_LAYER(DenseLayer, denoise_output);
    ALLOC_LAYER(DenseLayer, vad_output);

#define INPUT_VAL(name) do { \
    if (fscanf(f, "%d", &in) != 1 || in < 0 || in > 128) { \
        rnnoise_model_free(ret); \
        return NULL; \
    } \
    name = in; \
    } while (0)

#define INPUT_ACTIVATION(name) do { \
    int activation; \
    INPUT_VAL(activation); \
    switch (activation) { \
        case F_ACTIVATION_SIGMOID: \
            name = ACTIVATION_SIGMOID; \
            break; \
        case F_ACTIVATION_RELU: \
            name = ACTIVATION_RELU; \
            break; \
        default: \
            name = ACTIVATION_TANH; \
    } \
    } while (0)

#define INPUT_ARRAY(name, len) do { \
    rnn_weight *values = malloc((len) * sizeof(rnn_weight)); \
    if (!values) { \
        rnnoise_model_free(ret); \
        return NULL; \
    } \
    name = values; \
    for (i = 0; i < (len); i++) { \
        if (fscanf(f, "%d", &in) != 1) { \
            rnnoise_model_free(ret); \
            return NULL; \
        } \
        values[i] = in; \
    } \
    } while (0)

#define INPUT_DENSE(name) do { \
    INPUT_VAL(name->nb_inputs); \
    INPUT_VAL(name->nb_neurons); \
    ret->name ## _size = name->nb_neurons; \
    INPUT_ACTIVATION(name->activation); \
    INPUT_ARRAY(name->input_weights, name->nb_inputs * name->nb_neurons); \
    INPUT_ARRAY(name->bias, name->nb_neurons); \
    } while (0)

#define INPUT_GRU(name) do { \
    INPUT_VAL(name->nb_inputs); \
    INPUT_VAL(name->nb_neurons); \
    ret->name ## _size = name->nb_neurons; \
    INPUT_ACTIVATION(name->activation); \
    INPUT_ARRAY(name->input_weights, name->nb_inputs * name->nb_neurons * 3); \
    INPUT_ARRAY(name->recurrent_weights, name->nb_neurons * name->nb_neurons * 3); \
    INPUT_ARRAY(name->bias, name->nb_neurons * 3); \
    } while (0)

    INPUT_DENSE(input_dense);
    INPUT_GRU(vad_gru);
    INPUT_GRU(noise_gru);
    INPUT_GRU(denoise_gru);
    INPUT_DENSE(denoise_output);
    INPUT_DENSE(vad_output);

    return ret;
}